

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::IfConversion::SplatCondition
          (IfConversion *this,Vector *vec_data_ty,uint32_t cond,InstructionBuilder *builder)

{
  uint32_t uVar1;
  TypeManager *this_00;
  Instruction *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  Bool bool_ty;
  Vector bool_vec_ty;
  allocator_type local_ad;
  uint32_t local_ac;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  Type local_90;
  Vector local_68;
  
  local_90.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.kind_ = kBool;
  local_90._vptr_Type = (_func_int **)&PTR__Type_00a68f28;
  local_ac = cond;
  analysis::Vector::Vector(&local_68,&local_90,vec_data_ty->count_);
  this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
  uVar1 = analysis::TypeManager::GetTypeInstruction(this_00,&local_68.super_Type);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
             (ulong)vec_data_ty->count_,&local_ac,&local_ad);
  this_01 = InstructionBuilder::AddCompositeConstruct
                      (builder,uVar1,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8);
  uVar1 = Instruction::result_id(this_01);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_a8);
  analysis::Type::~Type(&local_68.super_Type);
  analysis::Type::~Type(&local_90);
  return uVar1;
}

Assistant:

uint32_t IfConversion::SplatCondition(analysis::Vector* vec_data_ty,
                                      uint32_t cond,
                                      InstructionBuilder* builder) {
  // If the data inputs to OpSelect are vectors, the condition for
  // OpSelect must be a boolean vector with the same number of
  // components. So splat the condition for the branch into a vector
  // type.
  analysis::Bool bool_ty;
  analysis::Vector bool_vec_ty(&bool_ty, vec_data_ty->element_count());
  uint32_t bool_vec_id =
      context()->get_type_mgr()->GetTypeInstruction(&bool_vec_ty);
  std::vector<uint32_t> ids(vec_data_ty->element_count(), cond);
  return builder->AddCompositeConstruct(bool_vec_id, ids)->result_id();
}